

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_importFilesWithSameName_Test::TestBody(Importer_importFilesWithSameName_Test *this)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  shared_ptr *psVar3;
  char cVar4;
  ulong uVar5;
  long *plVar6;
  char *pcVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  ulong uVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modelNames;
  AssertionResult gtest_ar_3;
  ImporterPtr importer;
  AssertionResult gtest_ar;
  ModelPtr anotherModel;
  ModelPtr model;
  ParserPtr parser;
  undefined1 local_138 [32];
  long *local_118;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  shared_ptr *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  long *local_98 [2];
  long local_88 [2];
  AssertHelper local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  ulong local_68;
  shared_ptr *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  libcellml::Parser::create(SUB81(local_40,0));
  pbVar1 = (pointer)(local_138 + 0x10);
  local_138._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"importer/model.cellml","");
  fileContents((string *)&local_f8);
  libcellml::Parser::parseModel(local_50);
  paVar2 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_138._0_8_ != pbVar1) {
    operator_delete((void *)local_138._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_138._16_8_)->_M_p + 1));
  }
  local_138._0_8_ = (pointer)0x0;
  local_108 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_f8,"size_t(0)","parser->issueCount()",(unsigned_long *)local_138,
             (unsigned_long *)&local_108);
  if ((char)local_f8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_138);
    if ((undefined8 *)local_f8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_f8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x29a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((pointer)local_138._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_138._0_8_)->_M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::create(SUB81(&local_108,0));
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"anotherModelWithKey_model.cellml","");
  libcellml::Model::create((string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  psVar3 = local_60;
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"b","");
  libcellml::Component::create((string *)local_138);
  libcellml::ComponentEntity::addComponent(psVar3);
  if ((pointer)local_138._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"a","");
  libcellml::Units::create((string *)local_138);
  libcellml::Model::addUnits(local_60);
  if ((pointer)local_138._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  psVar3 = local_108;
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"model.cellml","");
  libcellml::Importer::addModel(psVar3,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  psVar3 = local_108;
  local_138._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"importer/","");
  resourcePath((string *)&local_f8);
  libcellml::Importer::resolveImports(psVar3,local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_138._0_8_ != pbVar1) {
    operator_delete((void *)local_138._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_138._16_8_)->_M_p + 1));
  }
  local_138._0_8_ = (pointer)0x0;
  local_118 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_f8,"size_t(0)","importer->issueCount()",(unsigned_long *)local_138,
             (unsigned_long *)&local_118);
  if ((char)local_f8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_138);
    if ((undefined8 *)local_f8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_f8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x2a5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((pointer)local_138._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_138._0_8_)->_M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_138._0_8_ = &DAT_00000004;
  local_118 = (long *)libcellml::Importer::libraryCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_f8,"size_t(4)","importer->libraryCount()",(unsigned_long *)local_138
             ,(unsigned_long *)&local_118);
  if ((char)local_f8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_138);
    if ((undefined8 *)local_f8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_f8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x2a8,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((pointer)local_138._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_138._0_8_)->_M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = libcellml::Model::hasUnresolvedImports();
  local_138._0_8_ = CONCAT71(local_138._1_7_,cVar4) ^ 1;
  local_138._8_8_ = (pointer)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_f8,local_138,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x2aa,local_f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_118 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_118 != (long *)0x0)) {
        (**(code **)(*local_118 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_138 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"layer3_model","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"layer2_model","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"layer1_model","");
  plVar6 = local_88;
  local_98[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"anotherModelWithKey_model.cellml","");
  __l._M_len = 4;
  __l._M_array = &local_f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_138,__l,(allocator_type *)&local_118);
  lVar8 = -0x80;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  uVar9 = 0;
  while( true ) {
    local_68 = uVar9;
    uVar5 = libcellml::Importer::libraryCount();
    if (uVar5 <= uVar9) break;
    lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (local_138._0_8_ + local_68 * 0x20);
    libcellml::Importer::library((ulong *)local_78);
    libcellml::NamedEntity::name_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_118,"modelNames[i]","importer->library(i)->name()",lhs,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
    if (local_118._0_1_ == (AssertHelper)0x0) {
      testing::Message::Message((Message *)&local_f8);
      pcVar7 = "";
      if (local_110.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar7 = ((local_110.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
                 ,0x2af,pcVar7);
      testing::internal::AssertHelper::operator=(local_78,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        cVar4 = testing::internal::IsTrue(true);
        if ((cVar4 != '\0') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar9 = local_68 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Importer, importFilesWithSameName)
{
    // This test is to see whether the importer correctly resolves imported sources, where
    // the imported files all have the same file name.

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/model.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();

    // Manually add a model to the library with the "model.cellml" key.
    auto anotherModel = libcellml::Model::create("anotherModelWithKey_model.cellml");
    anotherModel->addComponent(libcellml::Component::create("b"));
    anotherModel->addUnits(libcellml::Units::create("a"));
    importer->addModel(anotherModel, "model.cellml");

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());

    // 4 items in the library.
    EXPECT_EQ(size_t(4), importer->libraryCount());

    EXPECT_FALSE(model->hasUnresolvedImports());

    // Compare the library items against their model name to be sure they're different.
    std::vector<std::string> modelNames = {"layer3_model", "layer2_model", "layer1_model", "anotherModelWithKey_model.cellml"};
    for (size_t i = 0; i < importer->libraryCount(); ++i) {
        EXPECT_EQ(modelNames[i], importer->library(i)->name());
    }
}